

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

int __thiscall
FNodeBuilder::FVertexMapSimple::SelectVertexExact(FVertexMapSimple *this,FPrivVert *vert)

{
  uint uVar1;
  int iVar2;
  FPrivVert *pFVar3;
  uint local_30;
  uint i;
  uint stop;
  FPrivVert *verts;
  FPrivVert *vert_local;
  FVertexMapSimple *this_local;
  
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->MyBuilder->Vertices,0);
  uVar1 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::Size(&this->MyBuilder->Vertices)
  ;
  local_30 = 0;
  while( true ) {
    if (uVar1 <= local_30) {
      iVar2 = InsertVertex(this,vert);
      return iVar2;
    }
    if ((pFVar3[local_30].super_FSimpleVert.x == (vert->super_FSimpleVert).x) &&
       (pFVar3[local_30].super_FSimpleVert.y == (vert->super_FSimpleVert).y)) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

int FNodeBuilder::FVertexMapSimple::SelectVertexExact(FNodeBuilder::FPrivVert &vert)
{
	FPrivVert *verts = &MyBuilder.Vertices[0];
	unsigned int stop = MyBuilder.Vertices.Size();

	for (unsigned int i = 0; i < stop; ++i)
	{
		if (verts[i].x == vert.x && verts[i].y == vert.y)
		{
			return i;
		}
	}
	// Not present: add it!
	return InsertVertex(vert);
}